

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sink.cpp
# Opt level: O3

int __thiscall kern::SyslogSink::kern_lvl_to_syslog_lvl(SyslogSink *this,LogLevel level)

{
  undefined3 in_register_00000031;
  int iVar1;
  
  iVar1 = CONCAT31(in_register_00000031,level);
  if (iVar1 < 8) {
    if (iVar1 - 1U < 2) {
      return 7;
    }
    if (iVar1 == 4) {
      return 6;
    }
  }
  else {
    if (iVar1 == 8) {
      return 4;
    }
    if (iVar1 == 0x10) {
      return 3;
    }
    if (iVar1 == 0x20) {
      return 1;
    }
  }
  return 5;
}

Assistant:

int SyslogSink::kern_lvl_to_syslog_lvl(LogLevel level) {
        switch(level) {
            case LogLevel::Trace:
                return LOG_DEBUG;
            case LogLevel::Debug:
                return LOG_DEBUG;
            case LogLevel::Info:
                return LOG_INFO;
            case LogLevel::Warning:
                return LOG_WARNING;
            case LogLevel::Error:
                return LOG_ERR;
            case LogLevel::Fatal:
                return LOG_ALERT;
            default:
                return LOG_NOTICE;
        }
    }